

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

bool iDynTree::isFakeLink(Model *modelWithFakeLinks,LinkIndex linkToCheck)

{
  uint uVar1;
  int iVar2;
  Link *this;
  IJoint *pIVar3;
  double dVar4;
  Neighbor NVar5;
  Neighbor neigh;
  double mass;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd0 [16];
  bool local_1;
  
  this = Model::getLink(in_stack_ffffffffffffffd0._0_8_,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Link::getInertia(this);
  dVar4 = (double)iDynTree::SpatialInertia::getMass();
  if (dVar4 <= 0.0) {
    uVar1 = Model::getNrOfNeighbors
                      (in_stack_ffffffffffffffd0._0_8_,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (uVar1 == 1) {
      NVar5 = Model::getNeighbor(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,
                                 in_stack_ffffffffffffffcc);
      pIVar3 = Model::getJoint((Model *)NVar5.neighborLink,
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      iVar2 = (*pIVar3->_vptr_IJoint[4])();
      if (iVar2 == 0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isFakeLink(const Model& modelWithFakeLinks, const LinkIndex linkToCheck)
{
    // First condition: base link is massless
    double mass = modelWithFakeLinks.getLink(linkToCheck)->getInertia().getMass();
    if( mass > 0.0 )
    {
        return false;
    }

    // Second condition: the base link has only one child
    if( modelWithFakeLinks.getNrOfNeighbors(linkToCheck) != 1 )
    {
        return false;
    }

    // Third condition: the base link is attached to its child with a fixed joint
    Neighbor neigh = modelWithFakeLinks.getNeighbor(linkToCheck,0);
    if( modelWithFakeLinks.getJoint(neigh.neighborJoint)->getNrOfDOFs() > 0 )
    {
        return false;
    }

    return true;
}